

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::color_blend_state_is_supported
          (Impl *this,VkPipelineColorBlendStateCreateInfo *info,VkDynamicState *dynamic_states,
          uint32_t num_dynamic_states)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  VkPipelineColorBlendAttachmentState *pVVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  VkBlendOp *pVVar10;
  ulong uVar11;
  VkDynamicState VVar12;
  long lVar13;
  byte bVar14;
  byte bVar15;
  
  if (1 < info->flags) {
    return false;
  }
  if ((info->flags != 0) &&
     ((this->features).rasterization_order_attachment_access.rasterizationOrderColorAttachmentAccess
      == 0)) {
    return false;
  }
  uVar11 = (ulong)num_dynamic_states;
  if (num_dynamic_states == 0) {
LAB_00111eae:
    if ((info->logicOpEnable != 0) && ((this->features2).features.logicOp == 0)) {
      return false;
    }
LAB_00111ec0:
    if (num_dynamic_states == 0) goto LAB_00111f22;
    VVar12 = *dynamic_states;
    if (VVar12 == VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT) {
      return true;
    }
  }
  else {
    VVar12 = VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT;
    if (*dynamic_states != VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT) {
      uVar7 = 1;
      do {
        uVar9 = uVar7;
        if (uVar11 == uVar9) break;
        uVar7 = uVar9 + 1;
      } while (dynamic_states[uVar9] != VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT);
      if (uVar11 <= uVar9) goto LAB_00111eae;
      goto LAB_00111ec0;
    }
  }
  uVar7 = 1;
  do {
    uVar9 = uVar7;
    if (uVar11 == uVar9) break;
    uVar7 = uVar9 + 1;
  } while (dynamic_states[uVar9] != VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT);
  if (VVar12 == VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT || uVar9 < uVar11) {
    return true;
  }
  uVar7 = 1;
  do {
    uVar9 = uVar7;
    if (uVar11 == uVar9) break;
    uVar7 = uVar9 + 1;
  } while (dynamic_states[uVar9] != VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT);
  if (uVar9 < uVar11) {
    return true;
  }
LAB_00111f22:
  uVar3 = info->attachmentCount;
  uVar11 = (ulong)uVar3;
  bVar8 = true;
  if (uVar11 == 0) {
    return true;
  }
  lVar13 = 0;
  bVar14 = 0;
  bVar15 = 0;
  do {
    iVar4 = *(int *)((long)&info->pAttachments->colorBlendOp + lVar13);
    iVar5 = *(int *)((long)&info->pAttachments->alphaBlendOp + lVar13);
    uVar1 = iVar4 + 0xc462f3e0;
    uVar2 = iVar5 + 0xc462f3e0;
    if ((uVar1 < 0x2e || uVar2 < 0x2e) &&
       (iVar5 != iVar4 || (this->props).blend_operation_advanced.advancedBlendAllOperations == 0))
    goto LAB_00111fd5;
    bVar15 = bVar15 | uVar2 < 0x2e;
    bVar14 = bVar14 | uVar1 < 0x2e;
    lVar13 = lVar13 + 0x20;
  } while (uVar11 << 5 != lVar13);
  if ((bool)(bVar14 | bVar15)) {
    if ((this->props).blend_operation_advanced.advancedBlendMaxColorAttachments < uVar3) {
LAB_00111fd5:
      bVar8 = false;
    }
    else if (uVar3 != 1 && (this->props).blend_operation_advanced.advancedBlendIndependentBlend == 0
            ) {
      pVVar6 = info->pAttachments;
      pVVar10 = &pVVar6[1].alphaBlendOp;
      lVar13 = uVar11 - 1;
      do {
        if ((*pVVar10 != pVVar6->alphaBlendOp) || (pVVar10[-3] != pVVar6->colorBlendOp))
        goto LAB_00111fd5;
        pVVar10 = pVVar10 + 8;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
  }
  return bVar8;
}

Assistant:

bool FeatureFilter::Impl::color_blend_state_is_supported(
		const VkPipelineColorBlendStateCreateInfo *info,
		const VkDynamicState *dynamic_states, uint32_t num_dynamic_states) const
{
	constexpr VkPipelineColorBlendStateCreateFlags supported_flags =
			VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT;

	if (info->flags & ~supported_flags)
		return false;

	if ((info->flags & VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT) != 0 &&
	    features.rasterization_order_attachment_access.rasterizationOrderColorAttachmentAccess == VK_FALSE)
		return false;

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT) &&
	    info->logicOpEnable && !features2.features.logicOp)
	{
		return false;
	}

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT) &&
	    !has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT))
	{
		bool has_advanced_color_blend = false;
		bool has_advanced_alpha_blend = false;

		for (uint32_t i = 0; i < info->attachmentCount; i++)
		{
			auto &att = info->pAttachments[i];

			bool advanced_color = blend_op_is_advanced(att.colorBlendOp);
			bool advanced_alpha = blend_op_is_advanced(att.alphaBlendOp);
			has_advanced_color_blend = has_advanced_color_blend || advanced_color;
			has_advanced_alpha_blend = has_advanced_alpha_blend || advanced_alpha;

			if (advanced_color || advanced_alpha)
			{
				if (att.alphaBlendOp != att.colorBlendOp)
					return false;
				if (!props.blend_operation_advanced.advancedBlendAllOperations)
					return false;
			}
		}

		if (has_advanced_color_blend || has_advanced_alpha_blend)
		{
			if (info->attachmentCount > props.blend_operation_advanced.advancedBlendMaxColorAttachments)
				return false;

			if (!props.blend_operation_advanced.advancedBlendIndependentBlend)
			{
				for (uint32_t i = 1; i < info->attachmentCount; i++)
				{
					if (info->pAttachments[i].alphaBlendOp != info->pAttachments[0].alphaBlendOp)
						return false;
					if (info->pAttachments[i].colorBlendOp != info->pAttachments[0].colorBlendOp)
						return false;
				}
			}
		}
	}

	return true;
}